

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O0

UBool __thiscall icu_63::anon_unknown_0::UnicodeSetPointer::allocate(UnicodeSetPointer *this)

{
  UnicodeSet *this_00;
  size_t in_RSI;
  UnicodeSet *local_40;
  UnicodeSetPointer *this_local;
  
  if (this->p == (UnicodeSet *)0x0) {
    this_00 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,in_RSI);
    local_40 = (UnicodeSet *)0x0;
    if (this_00 != (UnicodeSet *)0x0) {
      UnicodeSet::UnicodeSet(this_00);
      local_40 = this_00;
    }
    this->p = local_40;
  }
  return this->p != (UnicodeSet *)0x0;
}

Assistant:

inline UBool allocate() {
        if (p == 0) {
            p = new UnicodeSet();
        }
        return p != 0;
    }